

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::verifyImages
               (TestLog *log,TestContext *testCtx,RenderContext *renderCtx,
               ConstPixelBufferAccess *testImage,ConstPixelBufferAccess *referenceImage)

{
  int width;
  int height;
  MessageBuilder *pMVar1;
  MessageBuilder local_568;
  ConstPixelBufferAccess local_3e8;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  LogImage local_370;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  LogImage local_290;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  LogImage local_1b0;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  LogImageSet local_d0;
  PixelBufferAccess local_80;
  undefined1 local_58 [8];
  Surface diffMask;
  int faultyPixels;
  int faultyPixelLimit;
  int kernelRadius;
  ConstPixelBufferAccess *referenceImage_local;
  ConstPixelBufferAccess *testImage_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  TestLog *log_local;
  
  width = tcu::ConstPixelBufferAccess::getWidth(testImage);
  height = tcu::ConstPixelBufferAccess::getHeight(testImage);
  tcu::Surface::Surface((Surface *)local_58,width,height);
  tcu::Surface::getAccess(&local_80,(Surface *)local_58);
  diffMask.m_pixels.m_cap._4_4_ = compareImages(log,renderCtx,referenceImage,testImage,&local_80,1);
  if (0x14 < diffMask.m_pixels.m_cap._4_4_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Images",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Image comparison",&local_119);
    tcu::LogImageSet::LogImageSet(&local_d0,&local_f0,&local_118);
    tcu::TestLog::operator<<(log,&local_d0);
    tcu::LogImageSet::~LogImageSet(&local_d0);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"Test image",&local_1d1)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"Test image",&local_1f9)
    ;
    tcu::LogImage::LogImage
              (&local_1b0,&local_1d0,&local_1f8,testImage,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(log,&local_1b0);
    tcu::LogImage::~LogImage(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"Reference image",&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"Reference image",&local_2d9);
    tcu::LogImage::LogImage
              (&local_290,&local_2b0,&local_2d8,referenceImage,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(log,&local_290);
    tcu::LogImage::~LogImage(&local_290);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,"Difference mask",&local_391);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"Difference mask",&local_3b9);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_3e8,(Surface *)local_58);
    tcu::LogImage::LogImage
              (&local_370,&local_390,&local_3b8,&local_3e8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(log,&local_370);
    tcu::LogImage::~LogImage(&local_370);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator(&local_391);
    tcu::TestLog::operator<<(log,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::TestLog::operator<<(&local_568,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_568,(char (*) [5])0x2c0dbea);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)((long)&diffMask.m_pixels.m_cap + 4));
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [18])" faulty pixel(s).");
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_568);
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got faulty pixels");
  }
  tcu::Surface::~Surface((Surface *)local_58);
  return;
}

Assistant:

void verifyImages (tcu::TestLog& log, tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const tcu::ConstPixelBufferAccess& testImage, const tcu::ConstPixelBufferAccess& referenceImage)
{
	using tcu::TestLog;

	const int			kernelRadius		= 1;
	const int			faultyPixelLimit	= 20;
	int					faultyPixels;
	tcu::Surface		diffMask			(testImage.getWidth(), testImage.getHeight());

	faultyPixels = compareImages(log, renderCtx, referenceImage, testImage, diffMask.getAccess(), kernelRadius);

	if (faultyPixels > faultyPixelLimit)
	{
		log << TestLog::ImageSet("Images", "Image comparison");
		log << TestLog::Image("Test image", "Test image", testImage);
		log << TestLog::Image("Reference image", "Reference image", referenceImage);
		log << TestLog::Image("Difference mask", "Difference mask", diffMask.getAccess());
		log << TestLog::EndImageSet;

		log << tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
	}
}